

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address.cpp
# Opt level: O2

result<unsigned_int> *
sockpp::inet_address::resolve_name(result<unsigned_int> *__return_storage_ptr__,string *saddr)

{
  uint uVar1;
  int iVar2;
  gai_errc e;
  error_code eVar3;
  in_addr ia;
  addrinfo *res;
  addrinfo hints;
  
  iVar2 = inet_pton(2,(saddr->_M_dataplus)._M_p,&ia);
  if (iVar2 == 1) {
    __return_storage_ptr__->val_ = ia.s_addr;
  }
  else {
    hints.ai_flags = 0;
    hints.ai_protocol = 0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_next = (addrinfo *)0x0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_family = 2;
    hints.ai_socktype = 1;
    e = getaddrinfo((saddr->_M_dataplus)._M_p,(char *)0x0,(addrinfo *)&hints,(addrinfo **)&res);
    if (e != ~invalid_argument) {
      if (e == system_error) {
        eVar3 = result<sockpp::none>::last_error();
      }
      else {
        eVar3 = make_error_code(e);
      }
      __return_storage_ptr__->val_ = 0;
      (__return_storage_ptr__->err_)._M_value = eVar3._M_value;
      (__return_storage_ptr__->err_)._M_cat = eVar3._M_cat;
      return __return_storage_ptr__;
    }
    uVar1 = *(uint *)(res->ai_addr->sa_data + 2);
    freeaddrinfo((addrinfo *)res);
    __return_storage_ptr__->val_ = uVar1;
  }
  std::error_code::error_code(&__return_storage_ptr__->err_);
  return __return_storage_ptr__;
}

Assistant:

result<in_addr_t> inet_address::resolve_name(const string& saddr) noexcept {
#if !defined(_WIN32)
    in_addr ia;
    if (::inet_pton(ADDRESS_FAMILY, saddr.c_str(), &ia) == 1)
        return ia.s_addr;
#endif

    addrinfo *res, hints = addrinfo{};
    hints.ai_family = ADDRESS_FAMILY;
    hints.ai_socktype = SOCK_STREAM;

    int err = ::getaddrinfo(saddr.c_str(), NULL, &hints, &res);

    if (err != 0) {
        error_code ec{};
#if defined(_WIN32)
        ec = error_code{errno, system_category()};
#else
        if (err == EAI_SYSTEM)
            ec = result<>::last_error();
        else
            ec = make_error_code(static_cast<gai_errc>(err));
#endif
        return ec;
    }

    auto ipv4 = reinterpret_cast<sockaddr_in*>(res->ai_addr);
    auto addr = ipv4->sin_addr.s_addr;
    freeaddrinfo(res);
    return addr;
}